

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SeparationPart.cpp
# Opt level: O0

void __thiscall KDIS::DATA_TYPE::SeparationPart::SeparationPart(SeparationPart *this)

{
  SeparationPart *this_local;
  
  VariableParameter::VariableParameter(&this->super_VariableParameter);
  (this->super_VariableParameter).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__SeparationPart_003362e8;
  this->m_ui8Reason = '\0';
  this->m_ui8PreEntIndicator = '\0';
  this->m_ui8Padding = '\0';
  EntityIdentifier::EntityIdentifier(&this->m_ParentEntId);
  this->m_ui16Padding = 0;
  NamedLocationIdentifier::NamedLocationIdentifier(&this->m_StationLoc);
  (this->super_VariableParameter).m_ui8VarParamType = '\x03';
  return;
}

Assistant:

SeparationPart::SeparationPart()  :
    m_ui8Reason(0),
    m_ui8PreEntIndicator(0),
    m_ui8Padding(0),
    m_ui16Padding(0)
{
    m_ui8VarParamType = SeparationPartType;
}